

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlParseJson.c
# Opt level: O1

JL_STATUS ParseKeyName(ParseParameters *Params,_Bool IsBareWord)

{
  size_t sVar1;
  JL_STATUS JVar2;
  size_t amountProcessed;
  size_t local_10;
  
  local_10 = 0;
  JVar2 = ParseString(Params->JsonString + Params->StringIndex,
                      Params->JsonStringLength - Params->StringIndex,IsBareWord,false,&local_10,
                      &Params->Stack[Params->StackIndex].CurrentKeyName);
  if (JVar2 == JL_STATUS_SUCCESS) {
    sVar1 = Params->StringIndex;
    Params->Stack[Params->StackIndex].CurrentKeyStringIndex = sVar1;
    Params->StringIndex = sVar1 + local_10;
  }
  return JVar2;
}

Assistant:

static
JL_STATUS
    ParseKeyName
    (
        ParseParameters*    Params,
        bool                IsBareWord
    )
{
    JL_STATUS jlStatus;
    size_t amountProcessed = 0;

    jlStatus = ParseString(
        Params->JsonString + Params->StringIndex,
        Params->JsonStringLength - Params->StringIndex,
        IsBareWord,
        false,
        &amountProcessed,
        &Params->Stack[Params->StackIndex].CurrentKeyName );
    if( JL_STATUS_SUCCESS == jlStatus )
    {
        Params->Stack[Params->StackIndex].CurrentKeyStringIndex = Params->StringIndex;
        Params->StringIndex += amountProcessed;
    }

    return jlStatus;
}